

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>
::_update_entry(Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>
                *this,ID_index rowIndex,Index position)

{
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>
  *entry;
  reference ppEVar1;
  Entry *newEntry;
  Index position_local;
  ID_index rowIndex_local;
  Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>
  *this_local;
  
  newEntry._0_4_ = position;
  newEntry._4_4_ = rowIndex;
  _position_local = this;
  entry = New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>>
          ::construct<unsigned_int&,unsigned_int&>
                    ((New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>>
                      *)this->entryPool_,(uint *)this,(uint *)((long)&newEntry + 4));
  ppEVar1 = std::
            vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>
            ::operator[](&this->column_,(ulong)(Index)newEntry);
  *ppEVar1 = entry;
  Row_access<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>
  ::insert_entry(&this->super_Row_access_option,newEntry._4_4_,entry);
  return;
}

Assistant:

inline void Naive_vector_column<Master_matrix,Support>::_update_entry(ID_index rowIndex, Index position)
{
  if constexpr (Master_matrix::Option_list::has_row_access) {
    Entry* newEntry = entryPool_->construct(RA_opt::columnIndex_, rowIndex);
    column_[position] = newEntry;
    RA_opt::insert_entry(rowIndex, newEntry);
  } else {
    column_[position] = entryPool_->construct(rowIndex);
  }
}